

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O0

void __thiscall
NshHistoryEntryCount_SuccessWhenFull_Test::TestBody(NshHistoryEntryCount_SuccessWhenFull_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_868;
  Message local_860 [3];
  uint local_848;
  uint local_844;
  undefined1 local_840 [8];
  AssertionResult gtest_ar;
  char acStack_826 [2];
  uint i;
  char cStack_820;
  char cStack_81f;
  char new_entry [10];
  nsh_history_t hist;
  NshHistoryEntryCount_SuccessWhenFull_Test *this_local;
  
  nsh_history_reset((nsh_history_t *)(new_entry + 2));
  acStack_826[0] = 'n';
  acStack_826[1] = 'e';
  i._0_1_ = 'w';
  i._1_1_ = '_';
  i._2_1_ = 'e';
  i._3_1_ = 'n';
  cStack_820 = 't';
  cStack_81f = 'r';
  new_entry[0] = 'y';
  new_entry[1] = '\0';
  for (gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ < 0x10;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    nsh_history_add_entry((nsh_history_t *)(new_entry + 2),acStack_826);
  }
  local_844 = nsh_history_entry_count((nsh_history_t *)(new_entry + 2));
  local_848 = 0x10;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_840,"nsh_history_entry_count(&hist)","16u",&local_844,&local_848);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(local_860);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
               ,0x59,message);
    testing::internal::AssertHelper::operator=(&local_868,local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    testing::Message::~Message(local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  return;
}

Assistant:

TEST(NshHistoryEntryCount, SuccessWhenFull)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry[] = "new_entry";
    for (unsigned int i = 0; i < NSH_CMD_HISTORY_SIZE; i++) {
        nsh_history_add_entry(&hist, new_entry);
    }

    ASSERT_EQ(nsh_history_entry_count(&hist), NSH_CMD_HISTORY_SIZE);
}